

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void funcargs(LexState *ls,expdesc *f)

{
  int where;
  int iVar1;
  int i;
  int local_40;
  int line;
  int nparams;
  int base;
  expdesc args;
  FuncState *fs;
  expdesc *f_local;
  LexState *ls_local;
  
  args._16_8_ = ls->fs;
  where = ls->linenumber;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x28) {
    luaX_next(ls);
    if ((ls->t).token == 0x29) {
      nparams = 0;
    }
    else {
      explist(ls,(expdesc *)&nparams);
      if ((nparams == 0x12) || (nparams == 0x13)) {
        luaK_setreturns((FuncState *)args._16_8_,(expdesc *)&nparams,-1);
      }
    }
    check_match(ls,0x29,0x28,where);
  }
  else if (iVar1 == 0x7b) {
    constructor(ls,(expdesc *)&nparams);
  }
  else {
    if (iVar1 != 0x124) {
      luaX_syntaxerror(ls,"function arguments expected");
    }
    codestring((expdesc *)&nparams,(ls->t).seminfo.ts);
    luaX_next(ls);
  }
  iVar1 = (f->u).info;
  if ((nparams == 0x12) || (nparams == 0x13)) {
    local_40 = -1;
  }
  else {
    if (nparams != 0) {
      luaK_exp2nextreg((FuncState *)args._16_8_,(expdesc *)&nparams);
    }
    local_40 = (uint)*(byte *)(args._16_8_ + 0x44) - (iVar1 + 1);
  }
  i = luaK_codeABCk((FuncState *)args._16_8_,OP_CALL,iVar1,local_40 + 1,2,0);
  init_exp(f,VCALL,i);
  luaK_fixline((FuncState *)args._16_8_,where);
  *(char *)(args._16_8_ + 0x44) = (char)iVar1 + '\x01';
  return;
}

Assistant:

static void funcargs (LexState *ls, expdesc *f) {
  FuncState *fs = ls->fs;
  expdesc args;
  int base, nparams;
  int line = ls->linenumber;
  switch (ls->t.token) {
    case '(': {  /* funcargs -> '(' [ explist ] ')' */
      luaX_next(ls);
      if (ls->t.token == ')')  /* arg list is empty? */
        args.k = VVOID;
      else {
        explist(ls, &args);
        if (hasmultret(args.k))
          luaK_setmultret(fs, &args);
      }
      check_match(ls, ')', '(', line);
      break;
    }
    case '{': {  /* funcargs -> constructor */
      constructor(ls, &args);
      break;
    }
    case TK_STRING: {  /* funcargs -> STRING */
      codestring(&args, ls->t.seminfo.ts);
      luaX_next(ls);  /* must use 'seminfo' before 'next' */
      break;
    }
    default: {
      luaX_syntaxerror(ls, "function arguments expected");
    }
  }
  lua_assert(f->k == VNONRELOC);
  base = f->u.info;  /* base register for call */
  if (hasmultret(args.k))
    nparams = LUA_MULTRET;  /* open call */
  else {
    if (args.k != VVOID)
      luaK_exp2nextreg(fs, &args);  /* close last argument */
    nparams = fs->freereg - (base+1);
  }
  init_exp(f, VCALL, luaK_codeABC(fs, OP_CALL, base, nparams+1, 2));
  luaK_fixline(fs, line);
  fs->freereg = base+1;  /* call removes function and arguments and leaves
                            one result (unless changed later) */
}